

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

void all_different_imp(BoolView *b,vec<IntVar_*> *x,ConLevel cl)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  vec<IntView<0>_> *other;
  int in_EDX;
  vec<IntVar_*> *in_RSI;
  uint i_1;
  vec<IntView<0>_> u;
  int range;
  uint i;
  int max;
  int min;
  BoolView *in_stack_ffffffffffffff18;
  BoolView *in_stack_ffffffffffffff20;
  vec<IntView<0>_> *in_stack_ffffffffffffff28;
  vec<IntView<0>_> *in_stack_ffffffffffffff30;
  char *local_c0;
  int in_stack_ffffffffffffff9c;
  IntVar *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  AllDiffBoundsImp<0> *in_stack_ffffffffffffffb0;
  BoolView *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  vec<IntView<0>_> local_38;
  int local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  vec<IntVar_*> *local_10;
  
  local_18 = 0x7fffffff;
  local_1c = -0x80000000;
  local_20 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while( true ) {
    uVar5 = local_20;
    uVar1 = vec<IntVar_*>::size(local_10);
    __stream = _stderr;
    if (uVar1 <= uVar5) break;
    vec<IntVar_*>::operator[](local_10,local_20);
    iVar2 = IntVar::getMin((IntVar *)0x1a3451);
    if (iVar2 < local_18) {
      vec<IntVar_*>::operator[](local_10,local_20);
      local_18 = IntVar::getMin((IntVar *)0x1a3476);
    }
    vec<IntVar_*>::operator[](local_10,local_20);
    iVar2 = IntVar::getMax((IntVar *)0x1a3499);
    if (local_1c < iVar2) {
      vec<IntVar_*>::operator[](local_10,local_20);
      local_1c = IntVar::getMax((IntVar *)0x1a34be);
    }
    local_20 = local_20 + 1;
  }
  local_24 = (local_1c + 1) - local_18;
  if ((local_14 != 2) && (local_14 != 0)) {
    pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/alldiff.cpp"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      local_c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/alldiff.cpp"
      ;
    }
    else {
      local_c0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/alldiff.cpp"
                         ,0x2f);
      local_c0 = local_c0 + 1;
    }
    fprintf(__stream,"%s:%d: ",local_c0,0x3bc);
    fprintf(_stderr,"Not yet supported\n");
    abort();
  }
  vec<IntView<0>_>::vec(&local_38);
  uVar5 = 0;
  while( true ) {
    uVar1 = uVar5;
    uVar3 = vec<IntVar_*>::size(local_10);
    if (uVar3 <= uVar5) break;
    in_stack_ffffffffffffff30 = (vec<IntView<0>_> *)vec<IntVar_*>::operator[](local_10,uVar1);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffa0,*(IntVar **)in_stack_ffffffffffffff30
                        ,1,-local_18);
    vec<IntView<0>_>::push(in_stack_ffffffffffffff30,(IntView<0> *)in_stack_ffffffffffffff28);
    uVar5 = uVar1 + 1;
  }
  if (local_18 == 0) {
    other = (vec<IntView<0>_> *)operator_new(0x88);
    BoolView::BoolView(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    vec<IntView<0>>::vec<IntView<0>>(in_stack_ffffffffffffff30,other);
    AllDiffBoundsImp<0>::AllDiffBoundsImp
              (in_stack_ffffffffffffffb0,
               (BoolView *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (vec<IntView<0>_> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    vec<IntView<0>_>::~vec((vec<IntView<0>_> *)in_stack_ffffffffffffff20);
    BoolView::~BoolView((BoolView *)0x1a36eb);
  }
  else {
    in_stack_ffffffffffffff20 = (BoolView *)operator_new(0x88);
    BoolView::BoolView(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    vec<IntView<4>>::vec<IntView<0>>
              ((vec<IntView<4>_> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    AllDiffBoundsImp<4>::AllDiffBoundsImp
              ((AllDiffBoundsImp<4> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(vec<IntView<4>_> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac);
    vec<IntView<4>_>::~vec((vec<IntView<4>_> *)in_stack_ffffffffffffff20);
    BoolView::~BoolView((BoolView *)0x1a37b8);
  }
  vec<IntView<0>_>::~vec((vec<IntView<0>_> *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void all_different_imp(const BoolView& b, vec<IntVar*>& x, ConLevel cl) {
	int min = INT_MAX;
	int max = INT_MIN;
	for (unsigned int i = 0; i < x.size(); i++) {
		if (x[i]->getMin() < min) {
			min = x[i]->getMin();
		}
		if (x[i]->getMax() > max) {
			max = x[i]->getMax();
		}
	}
	const int range = max + 1 - min;
	if (!(cl == CL_BND || cl == CL_DEF)) {
		NOT_SUPPORTED;
	}
	vec<IntView<> > u;
	for (unsigned int i = 0; i < x.size(); i++) {
		u.push(IntView<>(x[i], 1, -min));
	}
	if (min == 0) {
		new AllDiffBoundsImp<0>(b, u, range);
	} else {
		new AllDiffBoundsImp<4>(b, u, range);
	}
}